

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall httplib::Server::routing(Server *this,Request *req,Response *res,Stream *strm)

{
  pointer ppVar1;
  pointer ppVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  pointer ppVar4;
  bool bVar5;
  bool bVar6;
  HandlerResponse HVar7;
  int iVar8;
  int iVar9;
  Handlers *handlers;
  pointer __re;
  function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>
  *pfVar10;
  undefined8 *local_198;
  undefined8 uStack_190;
  code *local_188;
  code *pcStack_180;
  undefined8 *local_178;
  undefined8 uStack_170;
  code *local_168;
  code *pcStack_160;
  undefined8 *local_158;
  undefined8 uStack_150;
  code *local_148;
  code *local_140;
  undefined8 *local_138;
  undefined8 uStack_130;
  code *local_128;
  code *local_120;
  undefined8 *local_118;
  undefined8 uStack_110;
  code *local_108;
  code *local_100;
  undefined8 *local_f8;
  undefined8 uStack_f0;
  code *local_e8;
  code *local_e0;
  undefined8 *local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  code *local_c0;
  undefined8 *local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  code *local_a0;
  undefined8 *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *local_80;
  undefined8 *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *local_60;
  undefined8 *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  if (((this->pre_routing_handler_).super__Function_base._M_manager != (_Manager_type)0x0) &&
     (HVar7 = (*(this->pre_routing_handler_)._M_invoker)
                        ((_Any_data *)&this->pre_routing_handler_,req,res), HVar7 == Handled)) {
    return true;
  }
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&req->method,"HEAD");
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&req->method,"GET");
  if (((iVar8 == 0) || (iVar9 == 0)) &&
     (bVar5 = handle_file_request(this,req,res,iVar8 == 0), bVar5)) {
    return true;
  }
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&req->method,"POST");
  if (((iVar8 != 0) &&
      (iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(&req->method,"PUT"), iVar8 != 0)) &&
     ((iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(&req->method,"PATCH"), iVar8 != 0 &&
      ((iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&req->method,"PRI"), iVar8 != 0 &&
       (iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&req->method,"DELETE"), iVar8 != 0)))))) goto LAB_0015ea7d;
  local_58 = (undefined8 *)0x0;
  uStack_50 = 0;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58 = (undefined8 *)operator_new(0x20);
  *local_58 = this;
  local_58[1] = strm;
  local_58[2] = req;
  local_58[3] = res;
  pcStack_40 = std::
               _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5824:11)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5824:11)>
             ::_M_manager;
  local_178 = (undefined8 *)operator_new(0x20);
  *local_178 = this;
  local_178[1] = strm;
  local_178[2] = req;
  local_178[3] = res;
  pcStack_40 = (code *)0x0;
  local_48 = (code *)0x0;
  pcStack_160 = std::
                _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5828:11)>
                ::_M_invoke;
  local_168 = std::
              _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5828:11)>
              ::_M_manager;
  uStack_170 = 0;
  pcStack_180 = std::
                _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5824:11)>
                ::_M_invoke;
  local_188 = std::
              _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5824:11)>
              ::_M_manager;
  uStack_190 = uStack_50;
  local_198 = local_58;
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&req->method,"POST");
  if (iVar8 == 0) {
    local_98 = (undefined8 *)0x0;
    uStack_90 = 0;
    local_88 = (code *)0x0;
    local_80 = pcStack_180;
    if (local_188 != (code *)0x0) {
      local_98 = local_198;
      uStack_90 = uStack_190;
      local_88 = local_188;
      local_188 = (code *)0x0;
      pcStack_180 = (code *)0x0;
    }
    local_78 = (undefined8 *)0x0;
    uStack_70 = 0;
    local_68 = (code *)0x0;
    local_60 = pcStack_160;
    if (local_168 != (code *)0x0) {
      local_78 = local_178;
      uStack_70 = uStack_170;
      local_68 = local_168;
      local_168 = (code *)0x0;
      pcStack_160 = (code *)0x0;
    }
    ppVar1 = (this->post_handlers_for_content_reader_).
             super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (this->post_handlers_for_content_reader_).
             super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = ppVar1 != ppVar2;
    if (bVar5) {
      bVar5 = true;
      pfVar10 = &ppVar1->second;
      do {
        _Var3._M_current = (req->path)._M_dataplus._M_p;
        bVar6 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )(_Var3._M_current + (req->path)._M_string_length),&req->matches,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)(pfVar10 + -0x20)
                           ,0);
        if (bVar6) {
          if (*(long *)(pfVar10 + 0x10) == 0) {
            std::__throw_bad_function_call();
          }
          (**(code **)(pfVar10 + 0x18))(pfVar10,req,res,&local_98);
          break;
        }
        bVar5 = (pointer)(pfVar10 + 0x20) != ppVar2;
        pfVar10 = pfVar10 + 0x40;
      } while (bVar5);
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,3);
    }
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,3);
    }
LAB_0015e9ed:
    if (bVar5) {
      if (local_168 != (code *)0x0) {
        (*local_168)(&local_178,&local_178,3);
      }
      if (local_188 == (code *)0x0) {
        return true;
      }
      (*local_188)(&local_198,&local_198,3);
      return true;
    }
  }
  else {
    iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&req->method,"PUT");
    if (iVar8 == 0) {
      local_d8 = (undefined8 *)0x0;
      uStack_d0 = 0;
      local_c8 = (code *)0x0;
      local_c0 = pcStack_180;
      if (local_188 != (code *)0x0) {
        local_d8 = local_198;
        uStack_d0 = uStack_190;
        local_c8 = local_188;
        local_188 = (code *)0x0;
        pcStack_180 = (code *)0x0;
      }
      local_b8 = (undefined8 *)0x0;
      uStack_b0 = 0;
      local_a8 = (code *)0x0;
      local_a0 = pcStack_160;
      if (local_168 != (code *)0x0) {
        local_b8 = local_178;
        uStack_b0 = uStack_170;
        local_a8 = local_168;
        local_168 = (code *)0x0;
        pcStack_160 = (code *)0x0;
      }
      ppVar1 = (this->put_handlers_for_content_reader_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = (this->put_handlers_for_content_reader_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar5 = ppVar1 != ppVar2;
      if (bVar5) {
        bVar5 = true;
        pfVar10 = &ppVar1->second;
        do {
          _Var3._M_current = (req->path)._M_dataplus._M_p;
          bVar6 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(_Var3._M_current + (req->path)._M_string_length),&req->matches
                             ,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                              (pfVar10 + -0x20),0);
          if (bVar6) {
            if (*(long *)(pfVar10 + 0x10) == 0) {
              std::__throw_bad_function_call();
            }
            (**(code **)(pfVar10 + 0x18))(pfVar10,req,res,&local_d8);
            break;
          }
          bVar5 = (pointer)(pfVar10 + 0x20) != ppVar2;
          pfVar10 = pfVar10 + 0x40;
        } while (bVar5);
      }
      if (local_a8 != (code *)0x0) {
        (*local_a8)(&local_b8,&local_b8,3);
      }
      if (local_c8 != (code *)0x0) {
        (*local_c8)(&local_d8,&local_d8,3);
      }
      goto LAB_0015e9ed;
    }
    iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&req->method,"PATCH");
    if (iVar8 == 0) {
      local_118 = (undefined8 *)0x0;
      uStack_110 = 0;
      local_108 = (code *)0x0;
      local_100 = pcStack_180;
      if (local_188 != (code *)0x0) {
        local_118 = local_198;
        uStack_110 = uStack_190;
        local_108 = local_188;
        local_188 = (code *)0x0;
        pcStack_180 = (code *)0x0;
      }
      local_f8 = (undefined8 *)0x0;
      uStack_f0 = 0;
      local_e8 = (code *)0x0;
      local_e0 = pcStack_160;
      if (local_168 != (code *)0x0) {
        local_f8 = local_178;
        uStack_f0 = uStack_170;
        local_e8 = local_168;
        local_168 = (code *)0x0;
        pcStack_160 = (code *)0x0;
      }
      ppVar1 = (this->patch_handlers_for_content_reader_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = (this->patch_handlers_for_content_reader_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar5 = ppVar1 != ppVar2;
      if (bVar5) {
        bVar5 = true;
        pfVar10 = &ppVar1->second;
        do {
          _Var3._M_current = (req->path)._M_dataplus._M_p;
          bVar6 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(_Var3._M_current + (req->path)._M_string_length),&req->matches
                             ,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                              (pfVar10 + -0x20),0);
          if (bVar6) {
            if (*(long *)(pfVar10 + 0x10) == 0) {
              std::__throw_bad_function_call();
            }
            (**(code **)(pfVar10 + 0x18))(pfVar10,req,res,&local_118);
            break;
          }
          bVar5 = (pointer)(pfVar10 + 0x20) != ppVar2;
          pfVar10 = pfVar10 + 0x40;
        } while (bVar5);
      }
      if (local_e8 != (code *)0x0) {
        (*local_e8)(&local_f8,&local_f8,3);
      }
      if (local_108 != (code *)0x0) {
        (*local_108)(&local_118,&local_118,3);
      }
      goto LAB_0015e9ed;
    }
    iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&req->method,"DELETE");
    if (iVar8 == 0) {
      local_158 = (undefined8 *)0x0;
      uStack_150 = 0;
      local_148 = (code *)0x0;
      local_140 = pcStack_180;
      if (local_188 != (code *)0x0) {
        local_158 = local_198;
        uStack_150 = uStack_190;
        local_148 = local_188;
        local_188 = (code *)0x0;
        pcStack_180 = (code *)0x0;
      }
      local_138 = (undefined8 *)0x0;
      uStack_130 = 0;
      local_128 = (code *)0x0;
      local_120 = pcStack_160;
      if (local_168 != (code *)0x0) {
        local_138 = local_178;
        uStack_130 = uStack_170;
        local_128 = local_168;
        local_168 = (code *)0x0;
        pcStack_160 = (code *)0x0;
      }
      ppVar1 = (this->delete_handlers_for_content_reader_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = (this->delete_handlers_for_content_reader_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar5 = ppVar1 != ppVar2;
      if (bVar5) {
        bVar5 = true;
        pfVar10 = &ppVar1->second;
        do {
          _Var3._M_current = (req->path)._M_dataplus._M_p;
          bVar6 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(_Var3._M_current + (req->path)._M_string_length),&req->matches
                             ,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                              (pfVar10 + -0x20),0);
          if (bVar6) {
            if (*(long *)(pfVar10 + 0x10) == 0) {
              std::__throw_bad_function_call();
            }
            (**(code **)(pfVar10 + 0x18))(pfVar10,req,res,&local_158);
            break;
          }
          bVar5 = (pointer)(pfVar10 + 0x20) != ppVar2;
          pfVar10 = pfVar10 + 0x40;
        } while (bVar5);
      }
      if (local_128 != (code *)0x0) {
        (*local_128)(&local_138,&local_138,3);
      }
      if (local_148 != (code *)0x0) {
        (*local_148)(&local_158,&local_158,3);
      }
      goto LAB_0015e9ed;
    }
  }
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,3);
  }
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,3);
  }
  bVar5 = read_content(this,strm,req,res);
  if (!bVar5) {
    return false;
  }
LAB_0015ea7d:
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&req->method,"GET");
  if ((iVar8 == 0) ||
     (iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&req->method,"HEAD"), iVar8 == 0)) {
    __re = (this->get_handlers_).
           super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    ppVar4 = (this->get_handlers_).
             super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__re == ppVar4) {
      return __re != ppVar4;
    }
    while (_Var3._M_current = (req->path)._M_dataplus._M_p,
          bVar5 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(_Var3._M_current + (req->path)._M_string_length),&req->matches
                             ,&__re->first,0), !bVar5) {
      __re = __re + 1;
      if (__re == ppVar4) {
        return __re != ppVar4;
      }
    }
  }
  else {
    iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&req->method,"POST");
    if (iVar8 == 0) {
      __re = (this->post_handlers_).
             super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      ppVar4 = (this->post_handlers_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__re == ppVar4) {
        return __re != ppVar4;
      }
      while (_Var3._M_current = (req->path)._M_dataplus._M_p,
            bVar5 = std::__detail::
                    __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                              (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )(_Var3._M_current + (req->path)._M_string_length),
                               &req->matches,&__re->first,0), !bVar5) {
        __re = __re + 1;
        if (__re == ppVar4) {
          return __re != ppVar4;
        }
      }
    }
    else {
      iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&req->method,"PUT");
      if (iVar8 != 0) {
        iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&req->method,"DELETE");
        if (iVar8 == 0) {
          handlers = &this->delete_handlers_;
        }
        else {
          iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&req->method,"OPTIONS");
          if (iVar8 == 0) {
            handlers = &this->options_handlers_;
          }
          else {
            iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&req->method,"PATCH");
            if (iVar8 != 0) {
              res->status = 400;
              return false;
            }
            handlers = &this->patch_handlers_;
          }
        }
        bVar5 = dispatch_request(this,req,res,handlers);
        return bVar5;
      }
      __re = (this->put_handlers_).
             super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      ppVar4 = (this->put_handlers_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__re == ppVar4) {
        return __re != ppVar4;
      }
      while (_Var3._M_current = (req->path)._M_dataplus._M_p,
            bVar5 = std::__detail::
                    __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                              (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )(_Var3._M_current + (req->path)._M_string_length),
                               &req->matches,&__re->first,0), !bVar5) {
        __re = __re + 1;
        if (__re == ppVar4) {
          return __re != ppVar4;
        }
      }
    }
  }
  if ((__re->second).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(__re->second)._M_invoker)((_Any_data *)&__re->second,req,res);
    return true;
  }
  std::__throw_bad_function_call();
}

Assistant:

inline bool Server::routing(Request &req, Response &res, Stream &strm) {
  if (pre_routing_handler_ &&
      pre_routing_handler_(req, res) == HandlerResponse::Handled) {
    return true;
  }

  // File handler
  bool is_head_request = req.method == "HEAD";
  if ((req.method == "GET" || is_head_request) &&
      handle_file_request(req, res, is_head_request)) {
    return true;
  }

  if (detail::expect_content(req)) {
    // Content reader handler
    {
      ContentReader reader(
          [&](ContentReceiver receiver) {
            return read_content_with_content_receiver(
                strm, req, res, std::move(receiver), nullptr, nullptr);
          },
          [&](MultipartContentHeader header, ContentReceiver receiver) {
            return read_content_with_content_receiver(strm, req, res, nullptr,
                                                      std::move(header),
                                                      std::move(receiver));
          });

      if (req.method == "POST") {
        if (dispatch_request_for_content_reader(
                req, res, std::move(reader),
                post_handlers_for_content_reader_)) {
          return true;
        }
      } else if (req.method == "PUT") {
        if (dispatch_request_for_content_reader(
                req, res, std::move(reader),
                put_handlers_for_content_reader_)) {
          return true;
        }
      } else if (req.method == "PATCH") {
        if (dispatch_request_for_content_reader(
                req, res, std::move(reader),
                patch_handlers_for_content_reader_)) {
          return true;
        }
      } else if (req.method == "DELETE") {
        if (dispatch_request_for_content_reader(
                req, res, std::move(reader),
                delete_handlers_for_content_reader_)) {
          return true;
        }
      }
    }

    // Read content into `req.body`
    if (!read_content(strm, req, res)) { return false; }
  }

  // Regular handler
  if (req.method == "GET" || req.method == "HEAD") {
    return dispatch_request(req, res, get_handlers_);
  } else if (req.method == "POST") {
    return dispatch_request(req, res, post_handlers_);
  } else if (req.method == "PUT") {
    return dispatch_request(req, res, put_handlers_);
  } else if (req.method == "DELETE") {
    return dispatch_request(req, res, delete_handlers_);
  } else if (req.method == "OPTIONS") {
    return dispatch_request(req, res, options_handlers_);
  } else if (req.method == "PATCH") {
    return dispatch_request(req, res, patch_handlers_);
  }

  res.status = 400;
  return false;
}